

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_load_save.cpp
# Opt level: O0

Am_Load_Save_Context * __thiscall
Am_Load_Save_Context::operator=(Am_Load_Save_Context *this,Am_Load_Save_Context *prev)

{
  Am_Load_Save_Context_Data *this_00;
  Am_Load_Save_Context_Data *old_data;
  Am_Load_Save_Context *prev_local;
  Am_Load_Save_Context *this_local;
  
  this_00 = this->data;
  this->data = prev->data;
  if (this->data != (Am_Load_Save_Context_Data *)0x0) {
    Am_Wrapper::Note_Reference(&this->data->super_Am_Wrapper);
  }
  if (this_00 != (Am_Load_Save_Context_Data *)0x0) {
    Am_Wrapper::Release(&this_00->super_Am_Wrapper);
  }
  return this;
}

Assistant:

void
Am_Load_Save_Context::Register_Prototype(const char *name, Am_Wrapper *value)
{
  if (!data) {
    data = new Am_Load_Save_Context_Data();
  }

  data = static_cast<Am_Load_Save_Context_Data *>(data->Make_Unique());

  Wrapper_Holder holder(value);

  data->names->SetAt(holder, Name_Num(name));
  data->prototypes->SetAt(Name_Num(name), holder);
}